

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O3

void __thiscall
CS248::DynamicScene::Skeleton::saveJoint
          (Skeleton *this,XMLDocument *xmlDoc,XMLElement *parentNode,Joint *joint)

{
  double dVar1;
  _Base_ptr p_Var2;
  pointer ppJVar3;
  XMLElement *addThis;
  XMLElement *pXVar4;
  XMLAttribute *pXVar5;
  XMLElement *pXVar6;
  _Rb_tree_node_base *p_Var7;
  pointer ppJVar8;
  
  addThis = tinyxml2::XMLDocument::NewElement(xmlDoc,"Joint");
  tinyxml2::XMLNode::InsertEndChild(&parentNode->super_XMLNode,&addThis->super_XMLNode);
  pXVar4 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Axis");
  dVar1 = (joint->axis).x;
  pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar4,"x");
  tinyxml2::XMLAttribute::SetAttribute(pXVar5,dVar1);
  dVar1 = (joint->axis).y;
  pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar4,"y");
  tinyxml2::XMLAttribute::SetAttribute(pXVar5,dVar1);
  dVar1 = (joint->axis).z;
  pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar4,"z");
  tinyxml2::XMLAttribute::SetAttribute(pXVar5,dVar1);
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar4->super_XMLNode);
  pXVar4 = tinyxml2::XMLDocument::NewElement(xmlDoc,"RenderScale");
  dVar1 = joint->renderScale;
  pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar4,"val");
  tinyxml2::XMLAttribute::SetAttribute(pXVar5,dVar1);
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar4->super_XMLNode);
  pXVar4 = tinyxml2::XMLDocument::NewElement(xmlDoc,"CapsuleRadius");
  dVar1 = joint->capsuleRadius;
  pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar4,"val");
  tinyxml2::XMLAttribute::SetAttribute(pXVar5,dVar1);
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar4->super_XMLNode);
  pXVar4 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Positions");
  for (p_Var7 = *(_Base_ptr *)
                 ((long)&(joint->super_SceneObject).positions.knots._M_t._M_impl.
                         super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var7 !=
      &(joint->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    pXVar6 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Knot");
    dVar1 = *(double *)(p_Var7 + 1);
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"Time");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,dVar1);
    p_Var2 = p_Var7[1]._M_parent;
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"x");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,(double)p_Var2);
    p_Var2 = p_Var7[1]._M_left;
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"y");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,(double)p_Var2);
    p_Var2 = p_Var7[1]._M_right;
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"z");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,(double)p_Var2);
    tinyxml2::XMLNode::InsertEndChild(&pXVar4->super_XMLNode,&pXVar6->super_XMLNode);
  }
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar4->super_XMLNode);
  pXVar4 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Rotations");
  for (p_Var7 = *(_Base_ptr *)
                 ((long)&(joint->super_SceneObject).rotations.knots._M_t._M_impl.
                         super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var7 !=
      &(joint->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    pXVar6 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Knot");
    dVar1 = *(double *)(p_Var7 + 1);
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"Time");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,dVar1);
    p_Var2 = p_Var7[1]._M_parent;
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"x");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,(double)p_Var2);
    p_Var2 = p_Var7[1]._M_left;
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"y");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,(double)p_Var2);
    p_Var2 = p_Var7[1]._M_right;
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"z");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,(double)p_Var2);
    tinyxml2::XMLNode::InsertEndChild(&pXVar4->super_XMLNode,&pXVar6->super_XMLNode);
  }
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar4->super_XMLNode);
  pXVar4 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Scales");
  for (p_Var7 = *(_Base_ptr *)
                 ((long)&(joint->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header.
                         _M_header + 0x10);
      (_Rb_tree_header *)p_Var7 !=
      &(joint->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    pXVar6 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Knot");
    dVar1 = *(double *)(p_Var7 + 1);
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"Time");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,dVar1);
    p_Var2 = p_Var7[1]._M_parent;
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"x");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,(double)p_Var2);
    p_Var2 = p_Var7[1]._M_left;
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"y");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,(double)p_Var2);
    p_Var2 = p_Var7[1]._M_right;
    pXVar5 = tinyxml2::XMLElement::FindOrCreateAttribute(pXVar6,"z");
    tinyxml2::XMLAttribute::SetAttribute(pXVar5,(double)p_Var2);
    tinyxml2::XMLNode::InsertEndChild(&pXVar4->super_XMLNode,&pXVar6->super_XMLNode);
  }
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar4->super_XMLNode);
  pXVar4 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Children");
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar4->super_XMLNode);
  ppJVar3 = (joint->kids).
            super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar8 = (joint->kids).
                 super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppJVar8 != ppJVar3;
      ppJVar8 = ppJVar8 + 1) {
    saveJoint(this,xmlDoc,pXVar4,*ppJVar8);
  }
  return;
}

Assistant:

void Skeleton::saveJoint(XMLDocument* xmlDoc, XMLElement* parentNode,
                         const Joint* joint) {
  XMLElement* pJoint = xmlDoc->NewElement("Joint");
  parentNode->InsertEndChild(pJoint);

  XMLElement* pElement = xmlDoc->NewElement("Axis");
  pElement->SetAttribute("x", joint->axis.x);
  pElement->SetAttribute("y", joint->axis.y);
  pElement->SetAttribute("z", joint->axis.z);
  pJoint->InsertEndChild(pElement);

  pElement = xmlDoc->NewElement("RenderScale");
  pElement->SetAttribute("val", joint->renderScale);
  pJoint->InsertEndChild(pElement);

  pElement = xmlDoc->NewElement("CapsuleRadius");
  pElement->SetAttribute("val", joint->capsuleRadius);
  pJoint->InsertEndChild(pElement);

  // positions
  pElement = xmlDoc->NewElement("Positions");
  for (const auto& item : joint->positions.knots) {
    XMLElement* pListElement = xmlDoc->NewElement("Knot");
    pListElement->SetAttribute("Time", item.first);
    pListElement->SetAttribute("x", item.second.x);
    pListElement->SetAttribute("y", item.second.y);
    pListElement->SetAttribute("z", item.second.z);

    pElement->InsertEndChild(pListElement);
  }
  pJoint->InsertEndChild(pElement);

  // rotations
  pElement = xmlDoc->NewElement("Rotations");
  for (const auto& item : joint->rotations.knots) {
    XMLElement* pListElement = xmlDoc->NewElement("Knot");
    pListElement->SetAttribute("Time", item.first);
    pListElement->SetAttribute("x", item.second.x);
    pListElement->SetAttribute("y", item.second.y);
    pListElement->SetAttribute("z", item.second.z);

    pElement->InsertEndChild(pListElement);
  }
  pJoint->InsertEndChild(pElement);

  // scales
  pElement = xmlDoc->NewElement("Scales");
  for (const auto& item : joint->scales.knots) {
    XMLElement* pListElement = xmlDoc->NewElement("Knot");
    pListElement->SetAttribute("Time", item.first);
    pListElement->SetAttribute("x", item.second.x);
    pListElement->SetAttribute("y", item.second.y);
    pListElement->SetAttribute("z", item.second.z);

    pElement->InsertEndChild(pListElement);
  }
  pJoint->InsertEndChild(pElement);

  XMLElement* pChildren = xmlDoc->NewElement("Children");
  pJoint->InsertEndChild(pChildren);
  for (Joint* j : joint->kids) {
    saveJoint(xmlDoc, pChildren, j);
  }
}